

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::PatchGetPropertyForTypeOfScoped<false,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,FrameDisplay *pDisplay,PropertyId propertyId,Var defaultInstance)

{
  bool bVar1;
  ScriptContext *scriptContext;
  UndeclaredBlockVariable *pUVar2;
  undefined1 local_58 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  AutoCleanup local_40;
  AutoCleanup autoCleanup;
  
  autoCatchHandlerExists.m_threadContext = (ThreadContext *)defaultInstance;
  autoCleanup.scriptContext._4_4_ = propertyId;
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_58,scriptContext,true);
  local_40.scriptContext = scriptContext;
  bVar1 = ScriptContext::IsScriptContextInDebugMode(scriptContext);
  if (bVar1) {
    ScriptContext::GetDebugContext(scriptContext);
  }
  pUVar2 = (UndeclaredBlockVariable *)
           PatchGetPropertyScoped<false,Js::InlineCache>
                     (functionBody,inlineCache,inlineCacheIndex,pDisplay,
                      autoCleanup.scriptContext._4_4_,autoCatchHandlerExists.m_threadContext);
  PatchGetPropertyForTypeOfScoped<false,_Js::InlineCache>::AutoCleanup::~AutoCleanup(&local_40);
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_58);
  if ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr !=
      pUVar2) {
    return pUVar2;
  }
  JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
}

Assistant:

Var JavascriptOperators::PatchGetPropertyForTypeOfScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var defaultInstance)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetPropertyForTypeOfScoped);
        Var value = nullptr;
        ScriptContext *scriptContext = functionBody->GetScriptContext();

        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        value = JavascriptOperators::PatchGetPropertyScoped<IsFromFullJit, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, pDisplay, propertyId, defaultInstance);
        END_TYPEOF_ERROR_HANDLER(scriptContext, value)

        return value;
        JIT_HELPER_END(Op_PatchGetPropertyForTypeOfScoped);
    }